

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O0

bool __thiscall draco::ObjEncoder::EncodeFaceAttributes(ObjEncoder *this,FaceIndex face_id)

{
  bool bVar1;
  long in_RDI;
  bool local_1;
  
  if ((*(long *)(in_RDI + 0x20) == 0) || (bVar1 = EncodeSubObject(this,face_id), bVar1)) {
    if ((*(long *)(in_RDI + 0x18) == 0) || (bVar1 = EncodeMaterial(this,face_id), bVar1)) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ObjEncoder::EncodeFaceAttributes(FaceIndex face_id) {
  if (sub_obj_att_) {
    if (!EncodeSubObject(face_id)) {
      return false;
    }
  }
  if (material_att_) {
    if (!EncodeMaterial(face_id)) {
      return false;
    }
  }
  return true;
}